

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpca_grammar_st(char *grammar,mpca_grammar_st_t *st)

{
  mpca_grammar_st_t *pmVar1;
  int iVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  mpc_input_t *i;
  char *__ptr;
  mpc_result_t mVar13;
  mpc_result_t r;
  mpc_result_t local_78;
  mpc_parser_t *local_70;
  mpca_grammar_st_t *local_68;
  mpc_parser_t *local_60;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  local_68 = st;
  local_38 = grammar;
  pmVar3 = mpc_new("grammar_total");
  local_40 = pmVar3;
  pmVar4 = mpc_new("grammar");
  pmVar5 = mpc_new("term");
  pmVar6 = mpc_new("factor");
  local_70 = mpc_new("base");
  pmVar7 = mpc_strip(pmVar4);
  pmVar7 = mpc_whole(pmVar7,mpc_soft_delete);
  pmVar8 = (mpc_parser_t *)calloc(1,0x38);
  pmVar8->name = (char *)0x0;
  pmVar8->type = '\x11';
  pmVar8->retained = '\0';
  (pmVar8->data).expect.x = pmVar7;
  mpc_define(pmVar3,pmVar8);
  pmVar3 = mpc_sym("|");
  local_48 = pmVar4;
  pmVar3 = mpc_and(2,mpcf_snd_free,pmVar3,pmVar4,free);
  puVar9 = (undefined8 *)calloc(1,0x38);
  *puVar9 = 0;
  *(undefined2 *)(puVar9 + 6) = 0x13;
  puVar9[1] = pmVar3;
  puVar9[3] = mpcf_ctor_null;
  local_50 = pmVar5;
  pmVar3 = mpc_and(2,mpcaf_grammar_or,pmVar5,puVar9,mpc_soft_delete);
  mpc_define(pmVar4,pmVar3);
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->name = (char *)0x0;
  pmVar3->type = '\x15';
  pmVar3->retained = '\0';
  (pmVar3->data).repeat.x = pmVar6;
  (pmVar3->data).apply.f = mpcaf_grammar_and;
  local_58 = pmVar6;
  mpc_define(pmVar5,pmVar3);
  pmVar3 = mpc_sym("*");
  pmVar4 = mpc_sym("+");
  pmVar5 = mpc_sym("?");
  pmVar7 = mpc_sym("!");
  pmVar8 = mpc_int();
  pmVar8 = mpc_tok_between(pmVar8,free,"{","}");
  puVar9 = (undefined8 *)calloc(1,0x38);
  *puVar9 = 0;
  *(undefined2 *)(puVar9 + 6) = 1;
  pmVar3 = mpc_or(6,pmVar3,pmVar4,pmVar5,pmVar7,pmVar8,puVar9);
  pmVar3 = mpc_and(2,mpcaf_grammar_repeat,local_70,pmVar3,mpc_soft_delete);
  mpc_define(pmVar6,pmVar3);
  pmVar3 = mpc_string_lit();
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  puVar9 = (undefined8 *)calloc(1,0x38);
  pmVar1 = local_68;
  *puVar9 = 0;
  *(undefined2 *)(puVar9 + 6) = 0x10;
  puVar9[1] = pmVar3;
  puVar9[2] = mpcaf_grammar_string;
  puVar9[3] = local_68;
  pmVar3 = mpc_char_lit();
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  puVar10 = (undefined8 *)calloc(1,0x38);
  *puVar10 = 0;
  *(undefined2 *)(puVar10 + 6) = 0x10;
  puVar10[1] = pmVar3;
  puVar10[2] = mpcaf_grammar_char;
  puVar10[3] = pmVar1;
  local_60 = mpc_regex_lit();
  pmVar3 = mpc_oneof("ms");
  puVar11 = (undefined8 *)calloc(1,0x38);
  *puVar11 = 0;
  *(undefined2 *)(puVar11 + 6) = 0x14;
  puVar11[3] = pmVar3;
  puVar11[2] = mpcf_strfold;
  puVar12 = (undefined8 *)calloc(1,0x38);
  *puVar12 = 0;
  *(undefined2 *)(puVar12 + 6) = 4;
  puVar12[2] = pmVar1;
  pmVar3 = mpc_and(3,mpcaf_fold_regex,local_60,puVar11,puVar12,free,free);
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  pmVar4 = mpc_digits();
  pmVar5 = mpc_ident();
  pmVar4 = mpc_or(2,pmVar4,pmVar5);
  pmVar4 = mpc_tok_between(pmVar4,free,"<",">");
  puVar11 = (undefined8 *)calloc(1,0x38);
  pmVar6 = local_48;
  *puVar11 = 0;
  *(undefined2 *)(puVar11 + 6) = 0x10;
  puVar11[1] = pmVar4;
  puVar11[2] = mpcaf_grammar_id;
  puVar11[3] = pmVar1;
  pmVar8 = mpc_tok_between(local_48,mpc_soft_delete,"(",")");
  pmVar7 = local_40;
  pmVar5 = local_50;
  pmVar4 = local_58;
  pmVar8 = mpc_or(5,puVar9,puVar10,pmVar3,puVar11,pmVar8);
  pmVar3 = local_70;
  mpc_define(local_70,pmVar8);
  mpc_optimise_unretained(pmVar7,1);
  mpc_optimise_unretained(pmVar6,1);
  mpc_optimise_unretained(pmVar4,1);
  mpc_optimise_unretained(pmVar5,1);
  mpc_optimise_unretained(pmVar3,1);
  i = mpc_input_new_string("<mpc_grammar_compiler>",local_38);
  iVar2 = mpc_parse_input(i,pmVar7,&local_78);
  mpc_input_delete(i);
  if (iVar2 == 0) {
    __ptr = mpc_err_string(local_78.error);
    mVar13.error = (mpc_err_t *)mpc_failf("Invalid Grammar: %s",__ptr);
    mpc_err_delete(local_78.error);
    free(__ptr);
    local_78.error = mVar13.error;
  }
  mpc_cleanup(5,pmVar7,pmVar6,pmVar5,pmVar4,local_70);
  mpc_optimise_unretained((mpc_parser_t *)local_78.error,1);
  mVar13 = local_78;
  if ((local_68->flags & 1) != 0) {
    local_78.output = calloc(1,0x38);
    ((local_78.error)->state).pos = 0;
    *(undefined2 *)&(local_78.error)->failure = 0x11;
    (((mpc_pdata_t *)&((local_78.error)->state).row)->expect).x = (mpc_parser_t *)mVar13;
  }
  return (mpc_parser_t *)local_78.error;
}

Assistant:

mpc_parser_t *mpca_grammar_st(const char *grammar, mpca_grammar_st_t *st) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *GrammarTotal, *Grammar, *Term, *Factor, *Base;

  GrammarTotal = mpc_new("grammar_total");
  Grammar = mpc_new("grammar");
  Term = mpc_new("term");
  Factor = mpc_new("factor");
  Base = mpc_new("base");

  mpc_define(GrammarTotal,
    mpc_predictive(mpc_total(Grammar, mpc_soft_delete))
  );

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
    mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(GrammarTotal);
  mpc_optimise(Grammar);
  mpc_optimise(Factor);
  mpc_optimise(Term);
  mpc_optimise(Base);

  if(!mpc_parse("<mpc_grammar_compiler>", grammar, GrammarTotal, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Grammar: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(5, GrammarTotal, Grammar, Term, Factor, Base);

  mpc_optimise(r.output);

  return (st->flags & MPCA_LANG_PREDICTIVE) ? mpc_predictive(r.output) : r.output;

}